

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

BCIns * rec_setup_root(jit_State *J)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  BCReg ra;
  BCIns ins;
  BCIns *pc;
  BCIns *pcj;
  jit_State *J_local;
  
  _ra = J->pc;
  uVar1 = *_ra;
  uVar3 = uVar1 >> 8 & 0xff;
  switch(uVar1 & 0xff) {
  case 0x41:
  case 0x42:
  case 0x45:
    _ra = _ra + 1;
    break;
  case 0x46:
    J->maxslot = uVar3;
    J->bc_extent = ((_ra[1] >> 0x10) - 0x8000) * -4;
    J->bc_min = _ra + ((ulong)(_ra[1] >> 0x10) - 0x7ffe);
    J->state = LJ_TRACE_RECORD_1ST;
    break;
  case 0x4a:
  case 0x4b:
  case 0x4c:
    J->maxslot = (uVar3 + (uVar1 >> 0x10)) - 1;
    break;
  case 0x4f:
    J->bc_extent = ((uVar1 >> 0x10) - 0x8000) * -4;
    _ra = _ra + ((ulong)(uVar1 >> 0x10) - 0x7fff);
    J->bc_min = _ra;
    break;
  case 0x52:
    if ((_ra[-1] & 0xff) == 0x57) {
      lj_trace_err(J,LJ_TRERR_LINNER);
    }
    J->maxslot = (uVar3 + (_ra[-1] >> 0x18)) - 1;
    J->bc_extent = ((uVar1 >> 0x10) - 0x8000) * -4;
    _ra = _ra + ((ulong)(uVar1 >> 0x10) - 0x7fff);
    J->bc_min = _ra;
    break;
  case 0x55:
    uVar2 = _ra[(ulong)(uVar1 >> 0x10) - 0x8000];
    if (((uVar2 & 0xff) == 0x58) && ((long)((ulong)(uVar2 >> 0x10) - 0x8000) < 0)) {
      J->bc_min = _ra + ((ulong)(uVar1 >> 0x10) - 0x8000) + ((ulong)(uVar2 >> 0x10) - 0x7fff);
      J->bc_extent = ((uVar2 >> 0x10) - 0x8000) * -4;
    }
    J->maxslot = uVar3;
    _ra = _ra + 1;
    break;
  case 0x59:
    J->maxslot = (uint)J->pt->numparams;
    _ra = _ra + 1;
  }
  return _ra;
}

Assistant:

static const BCIns *rec_setup_root(jit_State *J)
{
  /* Determine the next PC and the bytecode range for the loop. */
  const BCIns *pcj, *pc = J->pc;
  BCIns ins = *pc;
  BCReg ra = bc_a(ins);
  switch (bc_op(ins)) {
  case BC_FORL:
    J->bc_extent = (MSize)(-bc_j(ins))*sizeof(BCIns);
    pc += 1+bc_j(ins);
    J->bc_min = pc;
    break;
  case BC_ITERL:
    if (bc_op(pc[-1]) == BC_JLOOP)
      lj_trace_err(J, LJ_TRERR_LINNER);
    lj_assertJ(bc_op(pc[-1]) == BC_ITERC, "no ITERC before ITERL");
    J->maxslot = ra + bc_b(pc[-1]) - 1;
    J->bc_extent = (MSize)(-bc_j(ins))*sizeof(BCIns);
    pc += 1+bc_j(ins);
    lj_assertJ(bc_op(pc[-1]) == BC_JMP, "ITERL does not point to JMP+1");
    J->bc_min = pc;
    break;
  case BC_ITERN:
    lj_assertJ(bc_op(pc[1]) == BC_ITERL, "no ITERL after ITERN");
    J->maxslot = ra;
    J->bc_extent = (MSize)(-bc_j(pc[1]))*sizeof(BCIns);
    J->bc_min = pc+2 + bc_j(pc[1]);
    J->state = LJ_TRACE_RECORD_1ST;  /* Record the first ITERN, too. */
    break;
  case BC_LOOP:
    /* Only check BC range for real loops, but not for "repeat until true". */
    pcj = pc + bc_j(ins);
    ins = *pcj;
    if (bc_op(ins) == BC_JMP && bc_j(ins) < 0) {
      J->bc_min = pcj+1 + bc_j(ins);
      J->bc_extent = (MSize)(-bc_j(ins))*sizeof(BCIns);
    }
    J->maxslot = ra;
    pc++;
    break;
  case BC_RET:
  case BC_RET0:
  case BC_RET1:
    /* No bytecode range check for down-recursive root traces. */
    J->maxslot = ra + bc_d(ins) - 1;
    break;
  case BC_FUNCF:
    /* No bytecode range check for root traces started by a hot call. */
    J->maxslot = J->pt->numparams;
    pc++;
    break;
  case BC_CALLM:
  case BC_CALL:
  case BC_ITERC:
    /* No bytecode range check for stitched traces. */
    pc++;
    break;
  default:
    lj_assertJ(0, "bad root trace start bytecode %d", bc_op(ins));
    break;
  }
  return pc;
}